

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QVariant * __thiscall
QAbstractSpinBox::inputMethodQuery(QAbstractSpinBox *this,InputMethodQuery query)

{
  Int IVar1;
  uint uVar2;
  QAbstractSpinBoxPrivate *pQVar3;
  int in_EDX;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int hints;
  QAbstractSpinBoxPrivate *d;
  QVariant lineEditValue;
  QWidget *this_00;
  QFlagsStorageHelper<Qt::InputMethodHint,_4> local_2c;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QAbstractSpinBox *)0x687440);
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_4_ = 0xaaaaaaaa;
  local_28._4_4_ = 0xaaaaaaaa;
  local_28._8_4_ = 0xaaaaaaaa;
  local_28._12_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&pQVar3->edit->super_QWidget + 400))(&local_28,pQVar3->edit,in_EDX);
  if (in_EDX == 0x100) {
    local_2c.super_QFlagsStorage<Qt::InputMethodHint>.i =
         (QFlagsStorage<Qt::InputMethodHint>)QWidget::inputMethodHints(this_00);
    IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    if (IVar1 != 0) {
      uVar2 = ::QVariant::toInt((bool *)local_28.data);
      ::QVariant::QVariant((QVariant *)this_00,IVar1 | uVar2);
      goto LAB_006874f9;
    }
  }
  ::QVariant::QVariant((QVariant *)this_00,(QVariant *)local_28.data);
LAB_006874f9:
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)in_RDI;
}

Assistant:

QVariant QAbstractSpinBox::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QAbstractSpinBox);
    const QVariant lineEditValue = d->edit->inputMethodQuery(query);
    switch (query) {
    case Qt::ImHints:
        if (const int hints = inputMethodHints())
            return QVariant(hints | lineEditValue.toInt());
        break;
    default:
        break;
    }
    return lineEditValue;
}